

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int key_schedule_extract(st_ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  ptls_iovec_t ikm_00;
  ptls_iovec_t salt;
  
  sVar3 = ikm.len;
  puVar4 = ikm.base;
  sVar1 = sched->algo->digest_size;
  if (puVar4 == (uint8_t *)0x0) {
    sVar3 = sVar1;
    puVar4 = zeroes_of_max_digest_size;
  }
  sched->generation = sched->generation + 1;
  ikm_00.len = sVar3;
  ikm_00.base = puVar4;
  salt.len = sVar1;
  salt.base = sched->secret;
  iVar2 = ptls_hkdf_extract(sched->algo,sched->secret,salt,ikm_00);
  return iVar2;
}

Assistant:

static int key_schedule_extract(struct st_ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->algo->digest_size);

    ++sched->generation;
    int ret = ptls_hkdf_extract(sched->algo, sched->secret, ptls_iovec_init(sched->secret, sched->algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}